

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O3

ktx_error_code_e
ktxTexture_CreateFromStdioStream
          (FILE *stdioStream,ktxTextureCreateFlags createFlags,ktxTexture **newTex)

{
  ktx_error_code_e kVar1;
  ktxStream stream;
  ktxStream kStack_78;
  
  kVar1 = KTX_INVALID_VALUE;
  if (newTex != (ktxTexture **)0x0 && stdioStream != (FILE *)0x0) {
    kVar1 = ktxFileStream_construct(&kStack_78,stdioStream,false);
    if (kVar1 == KTX_SUCCESS) {
      kVar1 = ktxTexture_CreateFromStream(&kStack_78,createFlags,newTex);
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture_CreateFromStdioStream(FILE* stdioStream,
                                 ktxTextureCreateFlags createFlags,
                                 ktxTexture** newTex)
{
    ktxStream stream;
    KTX_error_code result;

    if (stdioStream == NULL || newTex == NULL)
        return KTX_INVALID_VALUE;

    result = ktxFileStream_construct(&stream, stdioStream, KTX_FALSE);
    if (result == KTX_SUCCESS) {
        result = ktxTexture_CreateFromStream(&stream, createFlags, newTex);
    }
    return result;
}